

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderImageLoadStoreTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::BinaryAtomicOperationCase::EndResultVerifier::operator()
          (EndResultVerifier *this,TestLog *log,ConstPixelBufferAccess *resultSlice,
          int sliceOrFaceNdx)

{
  ostringstream *this_00;
  ostringstream *this_01;
  ostringstream *poVar1;
  ChannelType CVar2;
  AtomicOperation op;
  int i_2;
  deUint32 value;
  int iVar3;
  int iVar4;
  char *__s;
  ulong uVar5;
  ConstPixelBufferAccess *__n;
  void *__buf;
  Vector<int,_3> (*arr) [5];
  int (*arr_00) [5];
  int (*arr_01) [5];
  int i_1;
  int iVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  ostringstream *this_02;
  IVec3 *pIVar10;
  int i;
  int iVar11;
  bool bVar12;
  bool bVar13;
  float fVar14;
  float fVar15;
  int sliceOrFaceNdx_local;
  int local_734;
  allocator<char> local_72d;
  int local_72c;
  int local_728;
  float local_724;
  TestLog *local_720;
  ulong local_718;
  float local_70c;
  EndResultVerifier *local_708;
  IVec2 dispatchSizeXY;
  int atomicArgs [5];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_6d8;
  string local_6b8;
  IVec3 invocationGlobalIDs [5];
  string local_658;
  Vector<int,_2> local_638;
  IVec3 gid;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  
  CVar2 = (resultSlice->m_format).type;
  if ((ulong)CVar2 < 0x22) {
    bVar12 = true;
    if ((0x2c0000000U >> ((ulong)CVar2 & 0x3f) & 1) != 0) goto LAB_0045e308;
  }
  bVar12 = CVar2 - SIGNED_INT8 < 3;
LAB_0045e308:
  dispatchSizeXY.m_data[0] = (resultSlice->m_size).m_data[0] * 5;
  dispatchSizeXY.m_data[1] = (resultSlice->m_size).m_data[1];
  sliceOrFaceNdx_local = sliceOrFaceNdx;
  local_720 = log;
  local_708 = this;
  de::toString<int>((string *)&local_330,&sliceOrFaceNdx_local);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1b0,
                 "EndResults",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_330);
  if (local_708->m_imageType == TEXTURETYPE_CUBE) {
    value = cubeFaceToGLFace((&(anonymous_namespace)::glslImageFuncZToCubeFace(int)::faces)
                             [sliceOrFaceNdx_local]);
    __s = glu::getCubeMapFaceName(value);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_6d8,__s,&local_72d);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   invocationGlobalIDs,"face ",&local_6d8);
  }
  else {
    de::toString<int>(&local_6d8,&sliceOrFaceNdx_local);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   invocationGlobalIDs,"slice ",&local_6d8);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4b0,
                 "Result Values, ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 invocationGlobalIDs);
  __n = resultSlice;
  tcu::LogImage::LogImage
            ((LogImage *)&gid,(string *)&local_1b0,(string *)&local_4b0,resultSlice,
             QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write((LogImage *)&gid,(int)local_720,__buf,(size_t)__n);
  tcu::LogImage::~LogImage((LogImage *)&gid);
  std::__cxx11::string::~string((string *)&local_4b0);
  std::__cxx11::string::~string((string *)invocationGlobalIDs);
  std::__cxx11::string::~string((string *)&local_6d8);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_330);
  uVar8 = 0;
  do {
    local_72c = (resultSlice->m_size).m_data[1];
    if (local_72c <= (int)uVar8) {
LAB_0045e8fa:
      return local_72c <= (int)uVar8;
    }
    iVar11 = (resultSlice->m_size).m_data[0];
    iVar7 = 0;
    local_718 = uVar8;
    while (iVar6 = (int)local_718, iVar7 < iVar11) {
      if (bVar12) {
        tcu::ConstPixelBufferAccess::getPixelInt
                  ((ConstPixelBufferAccess *)&gid,(int)resultSlice,iVar7,iVar6);
      }
      else {
        tcu::ConstPixelBufferAccess::getPixel
                  ((ConstPixelBufferAccess *)&gid,(int)resultSlice,iVar7,iVar6);
      }
      local_724 = (float)gid.m_data[0];
      local_70c = (float)gid.m_data[0];
      local_728 = gid.m_data[0];
      lVar9 = 0;
      do {
        tcu::Vector<int,_3>::Vector((Vector<int,_3> *)((long)invocationGlobalIDs[0].m_data + lVar9))
        ;
        iVar6 = sliceOrFaceNdx_local;
        lVar9 = lVar9 + 0xc;
      } while (lVar9 != 0x3c);
      iVar11 = (resultSlice->m_size).m_data[0];
      op = local_708->m_operation;
      pIVar10 = invocationGlobalIDs;
      local_734 = iVar7;
      for (lVar9 = 0; uVar8 = local_718, iVar4 = local_734, iVar3 = (int)local_718, lVar9 != 5;
          lVar9 = lVar9 + 1) {
        gid.m_data[1] = iVar3;
        gid.m_data[0] = iVar7;
        gid.m_data[2] = iVar6;
        pIVar10->m_data[2] = iVar6;
        *(undefined8 *)pIVar10->m_data = gid.m_data._0_8_;
        iVar4 = getAtomicFuncArgument(op,&gid,&dispatchSizeXY);
        atomicArgs[lVar9] = iVar4;
        pIVar10 = pIVar10 + 1;
        iVar7 = iVar7 + iVar11;
      }
      if (op < ATOMIC_OPERATION_EXCHANGE) {
        iVar7 = *(int *)(&DAT_00813734 + (ulong)op * 4);
        for (lVar9 = 0; uVar8 = local_718, iVar6 = local_728, lVar9 != 5; lVar9 = lVar9 + 1) {
          iVar7 = computeBinaryAtomicOperationResult(op,iVar7,atomicArgs[lVar9]);
        }
        if (iVar7 != local_728) {
          this_02 = (ostringstream *)&local_4b0.m_str;
          local_4b0.m_log = local_720;
          std::__cxx11::ostringstream::ostringstream(this_02);
          std::operator<<((ostream *)this_02,"// Failure: end result at pixel ");
          local_638.m_data[0] = local_734;
          local_638.m_data[1] = (int)uVar8;
          tcu::operator<<((ostream *)this_02,&local_638);
          std::operator<<((ostream *)this_02," of current layer is ");
          std::ostream::operator<<(this_02,iVar6);
          local_330.m_log =
               tcu::MessageBuilder::operator<<
                         (&local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          this_00 = &local_330.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::operator<<((ostream *)this_00,"// Note: relevant shader invocation global IDs are ");
          arrayStr<tcu::Vector<int,3>,5>(&local_6b8,(Functional *)invocationGlobalIDs,arr);
          std::operator<<((ostream *)this_00,(string *)&local_6b8);
          local_1b0.m_log =
               tcu::MessageBuilder::operator<<
                         (&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
          this_01 = &local_1b0.m_str;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
          std::operator<<((ostream *)this_01,"// Note: data expression values for the IDs are ");
          arrayStr<int,5>(&local_658,(Functional *)atomicArgs,arr_00);
          std::operator<<((ostream *)this_01,(string *)&local_658);
          gid.m_data._0_8_ =
               tcu::MessageBuilder::operator<<
                         (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          poVar1 = (ostringstream *)(gid.m_data + 2);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"// Note: reference value is ");
          std::ostream::operator<<(poVar1,iVar7);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&gid,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::__cxx11::string::~string((string *)&local_658);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
          std::__cxx11::string::~string((string *)&local_6b8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
LAB_0045e8f1:
          std::__cxx11::ostringstream::~ostringstream(this_02);
          goto LAB_0045e8fa;
        }
      }
      else if (op == ATOMIC_OPERATION_EXCHANGE) {
        uVar5 = 0;
        bVar13 = false;
        while ((uVar5 < 5 && (!bVar13))) {
          if (bVar12) {
            bVar13 = atomicArgs[uVar5] == local_728;
          }
          else {
            fVar15 = local_70c - (float)atomicArgs[uVar5];
            fVar14 = -fVar15;
            if (-fVar15 <= fVar15) {
              fVar14 = fVar15;
            }
            bVar13 = fVar14 <= 0.01;
          }
          uVar5 = uVar5 + 1;
        }
        if (!bVar13) {
          this_02 = (ostringstream *)&local_1b0.m_str;
          local_1b0.m_log = local_720;
          std::__cxx11::ostringstream::ostringstream(this_02);
          std::operator<<((ostream *)this_02,"// Failure: invalid value at pixel ");
          local_6b8._M_dataplus._M_p._0_4_ = iVar4;
          local_6b8._M_dataplus._M_p._4_4_ = iVar3;
          tcu::operator<<((ostream *)this_02,(Vector<int,_2> *)&local_6b8);
          std::operator<<((ostream *)this_02,": got ");
          if (bVar12) {
            de::toString<int>((string *)&local_330,(int *)&local_724);
          }
          else {
            de::toString<float>((string *)&local_330,&local_724);
          }
          std::operator<<((ostream *)this_02,(string *)&local_330);
          gid.m_data._0_8_ =
               tcu::MessageBuilder::operator<<
                         (&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          poVar1 = (ostringstream *)(gid.m_data + 2);
          std::__cxx11::ostringstream::ostringstream(poVar1);
          std::operator<<((ostream *)poVar1,"// Note: expected one of ");
          arrayStr<int,5>((string *)&local_4b0,(Functional *)atomicArgs,arr_01);
          std::operator<<((ostream *)poVar1,(string *)&local_4b0);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)&gid,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::string::~string((string *)&local_4b0);
          std::__cxx11::ostringstream::~ostringstream(poVar1);
          std::__cxx11::string::~string((string *)&local_330);
          goto LAB_0045e8f1;
        }
      }
      iVar7 = iVar4 + 1;
    }
    uVar8 = (ulong)(iVar6 + 1);
  } while( true );
}

Assistant:

bool operator() (TestLog& log, const ConstPixelBufferAccess& resultSlice, int sliceOrFaceNdx) const
	{
		const bool		isIntegerFormat		= isFormatTypeInteger(resultSlice.getFormat().type);
		const IVec2		dispatchSizeXY		(NUM_INVOCATIONS_PER_PIXEL*resultSlice.getWidth(), resultSlice.getHeight());

		log << TestLog::Image("EndResults" + toString(sliceOrFaceNdx),
							  "Result Values, " + (m_imageType == TEXTURETYPE_CUBE ? "face " + string(glu::getCubeMapFaceName(cubeFaceToGLFace(glslImageFuncZToCubeFace(sliceOrFaceNdx))))
																				   : "slice " + toString(sliceOrFaceNdx)),
							  resultSlice);

		for (int y = 0; y < resultSlice.getHeight(); y++)
		for (int x = 0; x < resultSlice.getWidth(); x++)
		{
			union
			{
				int		i;
				float	f;
			} result;

			if (isIntegerFormat)
				result.i = resultSlice.getPixelInt(x, y).x();
			else
				result.f = resultSlice.getPixel(x, y).x();

			// Compute the arguments that were given to the atomic function in the invocations that contribute to this pixel.

			IVec3	invocationGlobalIDs[NUM_INVOCATIONS_PER_PIXEL];
			int		atomicArgs[NUM_INVOCATIONS_PER_PIXEL];

			for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
			{
				const IVec3 gid(x + i*resultSlice.getWidth(), y, sliceOrFaceNdx);

				invocationGlobalIDs[i]	= gid;
				atomicArgs[i]			= getAtomicFuncArgument(m_operation, gid, dispatchSizeXY);
			}

			if (isOrderIndependentAtomicOperation(m_operation))
			{
				// Just accumulate the atomic args (and the initial value) according to the operation, and compare.

				DE_ASSERT(isIntegerFormat);

				int reference = getOperationInitialValue(m_operation);

				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL; i++)
					reference = computeBinaryAtomicOperationResult(m_operation, reference, atomicArgs[i]);

				if (result.i != reference)
				{
					log << TestLog::Message << "// Failure: end result at pixel " << IVec2(x, y) << " of current layer is " << result.i << TestLog::EndMessage
						<< TestLog::Message << "// Note: relevant shader invocation global IDs are " << arrayStr(invocationGlobalIDs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: data expression values for the IDs are " << arrayStr(atomicArgs) << TestLog::EndMessage
						<< TestLog::Message << "// Note: reference value is " << reference << TestLog::EndMessage;
					return false;
				}
			}
			else if (m_operation == ATOMIC_OPERATION_EXCHANGE)
			{
				// Check that the end result equals one of the atomic args.

				bool matchFound = false;

				for (int i = 0; i < NUM_INVOCATIONS_PER_PIXEL && !matchFound; i++)
					matchFound = isIntegerFormat ? result.i == atomicArgs[i]
												 : de::abs(result.f - (float)atomicArgs[i]) <= 0.01f;

				if (!matchFound)
				{
					log << TestLog::Message << "// Failure: invalid value at pixel " << IVec2(x, y) << ": got " << (isIntegerFormat ? toString(result.i) : toString(result.f)) << TestLog::EndMessage
											<< TestLog::Message << "// Note: expected one of " << arrayStr(atomicArgs) << TestLog::EndMessage;

					return false;
				}
			}
			else
				DE_ASSERT(false);
		}

		return true;
	}